

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O2

void __thiscall Pl_DCT::decompress(Pl_DCT *this,void *cinfo_p,Buffer *b)

{
  int iVar1;
  Pipeline *pPVar2;
  uint uVar3;
  undefined8 *puVar4;
  size_t sVar5;
  uchar *puVar6;
  runtime_error *this_00;
  ulong uVar7;
  jpeg_progress_mgr progress_mgr;
  
  jpeg_CreateDecompress(cinfo_p,0x50,0x290);
  puVar4 = *(undefined8 **)((long)cinfo_p + 8);
  if (0 < (long)(anonymous_namespace)::memory_limit) {
    puVar4[0xb] = (anonymous_namespace)::memory_limit;
  }
  puVar4 = (undefined8 *)(*(code *)*puVar4)(cinfo_p,0,0x38);
  *(undefined8 **)((long)cinfo_p + 0x28) = puVar4;
  puVar4[2] = init_buffer_source;
  puVar4[3] = fill_buffer_input_buffer;
  puVar4[4] = skip_buffer_input_data;
  puVar4[5] = jpeg_resync_to_restart;
  puVar4[6] = term_buffer_source;
  sVar5 = Buffer::getSize(b);
  puVar4[1] = sVar5;
  puVar6 = Buffer::getBuffer(b);
  *puVar4 = puVar6;
  jpeg_read_header(cinfo_p,1);
  jpeg_calc_output_dimensions(cinfo_p);
  iVar1 = *(int *)((long)cinfo_p + 0x88);
  uVar3 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert
                    ((int *)((long)cinfo_p + 0x94));
  uVar3 = uVar3 * iVar1;
  if (0 < (long)(anonymous_namespace)::memory_limit) {
    uVar7 = (ulong)(uint)(*(int *)((long)cinfo_p + 0x8c) * 0x14);
    if ((anonymous_namespace)::memory_limit / uVar7 < (ulong)uVar3) {
      this_00 = (runtime_error *)
                __cxa_allocate_exception(0x10,uVar7,(anonymous_namespace)::memory_limit % uVar7);
      std::runtime_error::runtime_error
                (this_00,"Pl_DCT::decompress: JPEG data large - may be too slow");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (0 < (anonymous_namespace)::scan_limit) {
    progress_mgr.progress_monitor = progress_monitor;
    *(jpeg_progress_mgr **)((long)cinfo_p + 0x10) = &progress_mgr;
  }
  puVar4 = (undefined8 *)(**(code **)(*(long *)((long)cinfo_p + 8) + 0x10))(cinfo_p,1,uVar3,1);
  jpeg_start_decompress(cinfo_p);
  while (*(uint *)((long)cinfo_p + 0xa8) < *(uint *)((long)cinfo_p + 0x8c)) {
    jpeg_read_scanlines(cinfo_p,puVar4,1);
    pPVar2 = (this->super_Pipeline).next_;
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,*puVar4,(ulong)uVar3);
  }
  jpeg_finish_decompress(cinfo_p);
  (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_DCT::decompress(void* cinfo_p, Buffer* b)
{
    auto* cinfo = reinterpret_cast<jpeg_decompress_struct*>(cinfo_p);

#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
    jpeg_create_decompress(cinfo);
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif

    if (memory_limit > 0) {
        cinfo->mem->max_memory_to_use = memory_limit;
    }

    jpeg_buffer_src(cinfo, b);

    (void)jpeg_read_header(cinfo, TRUE);
    (void)jpeg_calc_output_dimensions(cinfo);
    unsigned int width = cinfo->output_width * QIntC::to_uint(cinfo->output_components);
    if (memory_limit > 0 &&
        width > (static_cast<unsigned long>(memory_limit) / (20U * cinfo->output_height))) {
        // Even if jpeglib does not run out of memory, qpdf will while buffering the data before
        // writing it. Furthermore, for very large images runtime can be significant before the
        // first warning is encountered causing a timeout in oss-fuzz.
        throw std::runtime_error("Pl_DCT::decompress: JPEG data large - may be too slow");
    }
    jpeg_progress_mgr progress_mgr;
    if (scan_limit > 0) {
        progress_mgr.progress_monitor = &progress_monitor;
        cinfo->progress = &progress_mgr;
    }
    JSAMPARRAY buffer =
        (*cinfo->mem->alloc_sarray)(reinterpret_cast<j_common_ptr>(cinfo), JPOOL_IMAGE, width, 1);

    (void)jpeg_start_decompress(cinfo);
    while (cinfo->output_scanline < cinfo->output_height) {
        (void)jpeg_read_scanlines(cinfo, buffer, 1);
        next()->write(buffer[0], width * sizeof(buffer[0][0]));
    }
    (void)jpeg_finish_decompress(cinfo);
    next()->finish();
}